

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialog::setDirectoryUrl(QFileDialog *this,QUrl *directory)

{
  QDialogPrivate *this_00;
  char cVar1;
  Type *this_01;
  QPlatformDialogHelper *pQVar2;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *this_02;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_02 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *)
            directory;
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
              operator()(this_02);
    QUrl::operator=(this_01,directory);
    QFileDialogOptions::setInitialDirectory((QUrl *)this_00[1].super_QWidgetPrivate.toolTip.d.ptr);
    if (this_00->nativeDialogInUse == true) {
      pQVar2 = QDialogPrivate::platformHelper(this_00);
      if (pQVar2 != (QPlatformDialogHelper *)0x0) {
        cVar1 = (**(code **)(*(long *)pQVar2 + 0xd0))(pQVar2,directory);
        if (cVar1 != '\0') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,directory);
            return;
          }
          goto LAB_004e67f0;
        }
      }
    }
    else {
      cVar1 = QUrl::isLocalFile();
      if (cVar1 == '\0') {
        if ((this_00->nativeDialogInUse == false) &&
           (this_00[1].super_QWidgetPrivate.focus_child != (QWidget *)0x0)) {
          setDirectoryUrl();
        }
      }
      else {
        QUrl::toLocalFile();
        setDirectory(this,&local_38);
        if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_004e67f0:
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setDirectoryUrl(const QUrl &directory)
{
    Q_D(QFileDialog);
    if (!directory.isValid())
        return;

    QFileDialogPrivate::setLastVisitedDirectory(directory);
    d->options->setInitialDirectory(directory);

    if (d->nativeDialogInUse)
        d->setDirectory_sys(directory);
    else if (directory.isLocalFile())
        setDirectory(directory.toLocalFile());
    else if (Q_UNLIKELY(d->usingWidgets()))
        qWarning("Non-native QFileDialog supports only local files");
}